

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O3

void __thiscall
test_adjacency_graph_contains_undirected_Test::~test_adjacency_graph_contains_undirected_Test
          (test_adjacency_graph_contains_undirected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, contains_undirected) {
  Adjacency_Graph<false> graph({{0, 1}, {1, 2}, {2, 3}, {0, 3}, {1, 3}});

  EXPECT_TRUE(graph.contains({0, 1}));
  EXPECT_TRUE(graph.contains({1, 0}));
  EXPECT_TRUE(graph.contains({1, 2}));
  EXPECT_TRUE(graph.contains({2, 1}));
  EXPECT_TRUE(graph.contains({2, 3}));
  EXPECT_TRUE(graph.contains({3, 2}));
  EXPECT_TRUE(graph.contains({0, 3}));
  EXPECT_TRUE(graph.contains({3, 0}));
  EXPECT_TRUE(graph.contains({1, 3}));
  EXPECT_TRUE(graph.contains({3, 1}));
  EXPECT_FALSE(graph.contains({0, 2}));
  EXPECT_FALSE(graph.contains({2, 0}));
}